

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O1

void __thiscall
boost::runtime::unrecognized_param::unrecognized_param
          (unrecognized_param *this,unrecognized_param *param_1)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  *(undefined ***)
   &(this->
    super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>).
    super_input_error.super_param_error = &PTR__param_error_001cbb58;
  uVar2 = *(undefined4 *)
           ((long)&(param_1->
                   super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
                   ).super_input_error.super_param_error.param_name.m_begin + 4);
  uVar3 = *(undefined4 *)
           &(param_1->
            super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
            ).super_input_error.super_param_error.param_name.m_end;
  uVar4 = *(undefined4 *)
           ((long)&(param_1->
                   super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
                   ).super_input_error.super_param_error.param_name.m_end + 4);
  *(undefined4 *)
   &(this->
    super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>).
    super_input_error.super_param_error.param_name.m_begin =
       *(undefined4 *)
        &(param_1->
         super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
         ).super_input_error.super_param_error.param_name.m_begin;
  *(undefined4 *)
   ((long)&(this->
           super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
           ).super_input_error.super_param_error.param_name.m_begin + 4) = uVar2;
  *(undefined4 *)
   &(this->
    super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>).
    super_input_error.super_param_error.param_name.m_end = uVar3;
  *(undefined4 *)
   ((long)&(this->
           super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
           ).super_input_error.super_param_error.param_name.m_end + 4) = uVar4;
  (this->super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
  ).super_input_error.super_param_error.msg._M_dataplus._M_p =
       (pointer)&(this->
                 super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
                 ).super_input_error.super_param_error.msg.field_2;
  pcVar1 = (param_1->
           super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
           ).super_input_error.super_param_error.msg._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(this->
              super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
              ).super_input_error.super_param_error.msg,pcVar1,
             pcVar1 + (param_1->
                      super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
                      ).super_input_error.super_param_error.msg._M_string_length);
  *(undefined ***)
   &(this->
    super_specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>).
    super_input_error.super_param_error = &PTR__unrecognized_param_001cce60;
  std::
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ::vector(&this->m_typo_candidates,&param_1->m_typo_candidates);
  return;
}

Assistant:

explicit    unrecognized_param( std::vector<cstring>&& type_candidates )
    : specific_param_error<unrecognized_param,input_error>( "" )
    , m_typo_candidates( std::move( type_candidates ) ) {}